

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::PatchGetValueForTypeOf<true,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,Var instance,PropertyId propertyId)

{
  code *pcVar1;
  PropertyId propertyId_00;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  undefined4 *puVar4;
  ThreadContext *pTVar5;
  PropertyRecord *pPVar6;
  undefined1 local_a8 [8];
  PropertyValueInfo info;
  AutoCatchHandlerExists autoCatchHandlerExists;
  Var value;
  AutoCleanup autoCleanup;
  RecyclableObject *local_40;
  RecyclableObject *object;
  
  autoCleanup.scriptContext = (ScriptContext *)inlineCache;
  object._4_4_ = propertyId;
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar2 = JavascriptStackWalker::ValidateTopJitFrame(scriptContext);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1f37,
                                "(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext))",
                                "Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_40 = (RecyclableObject *)0x0;
  BVar3 = GetPropertyObject(instance,scriptContext,&local_40);
  if (BVar3 == 0) {
    bVar2 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (bVar2) {
      pPVar6 = ScriptContext::GetPropertyName(scriptContext,object._4_4_);
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec48,(PCWSTR)(pPVar6 + 1));
    }
    autoCatchHandlerExists.m_threadContext =
         (ThreadContext *)
         (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
         .undefinedValue.ptr;
  }
  else {
    local_a8 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_a8,functionBody,(InlineCache *)autoCleanup.scriptContext,
               inlineCacheIndex,false);
    propertyId_00 = object._4_4_;
    bVar2 = CacheOperators::TryGetProperty<true,true,true,true,true,true,true,false,false,false>
                      (instance,false,local_40,object._4_4_,&autoCatchHandlerExists.m_threadContext,
                       scriptContext,(PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_a8
                      );
    if (!bVar2) {
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,InlineCachePhase);
      if ((bVar2) && (DAT_0145948a == '\x01')) {
        CacheOperators::TraceCache
                  ((InlineCache *)autoCleanup.scriptContext,L"PatchGetValueForTypeOf",propertyId_00,
                   scriptContext,local_40);
      }
      JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
                ((AutoCatchHandlerExists *)&info.inlineCacheIndex,scriptContext,true);
      PatchGetValueForTypeOf<true,Js::InlineCache>(Js::FunctionBody*,Js::
      InlineCache*,unsigned_int,void*,int)::AutoCleanup::AutoCleanup(Js::ScriptContext__
                (&value,scriptContext);
      pTVar5 = (ThreadContext *)
               GetProperty(instance,local_40,propertyId_00,scriptContext,
                           (PropertyValueInfo *)local_a8);
      PatchGetValueForTypeOf<true,_Js::InlineCache>::AutoCleanup::~AutoCleanup
                ((AutoCleanup *)&value);
      JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
                ((AutoCatchHandlerExists *)&info.inlineCacheIndex);
      autoCatchHandlerExists.m_threadContext = pTVar5;
      if ((ThreadContext *)
          (((scriptContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
          == pTVar5) {
        JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ec07,(PCWSTR)0x0);
      }
    }
  }
  return autoCatchHandlerExists.m_threadContext;
}

Assistant:

Var JavascriptOperators::PatchGetValueForTypeOf(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetValueForTypeOf);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        Assert(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext));

        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined,
                    scriptContext->GetPropertyName(propertyId)->GetBuffer());
            }
            else
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
        }

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        Var value;
        if (CacheOperators::TryGetProperty<true, true, true, true, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
            instance, false, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetValueForTypeOf"), propertyId, scriptContext, object);
        }
#endif
        Var prop = nullptr;

        BEGIN_TYPEOF_ERROR_HANDLER(scriptContext);
        prop = JavascriptOperators::GetProperty(instance, object, propertyId, scriptContext, &info);
        END_TYPEOF_ERROR_HANDLER(scriptContext, prop);

        return prop;
        JIT_HELPER_END(Op_PatchGetValueForTypeOf);
    }